

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double empirical_discrete_sample(int a,double *b,double *c,int *seed)

{
  double dVar1;
  
  dVar1 = r8_uniform_01(seed);
  dVar1 = empirical_discrete_cdf_inv(dVar1,a,b,c);
  return dVar1;
}

Assistant:

double empirical_discrete_sample ( int a, double b[], double c[], int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    EMPIRICAL_DISCRETE_SAMPLE samples the Empirical Discrete PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int A, the number of values.
//    0 < A.
//
//    Input, double B(A), the weights of each value.
//    0 <= B(1:A) and at least one value is nonzero.
//
//    Input, double C(A), the values.
//    The values must be distinct and in ascending order.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double EMPIRICAL_DISCRETE_SAMPLE, a sample of the PDF.
//
{
  double cdf;
  double x;

  cdf = r8_uniform_01 ( seed );

  x = empirical_discrete_cdf_inv ( cdf, a, b, c );

  return x;
}